

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall tinyxml2::XMLNode::ParseDeep(XMLNode *this,char *p,StrPair *parentEnd)

{
  XMLDocument *pXVar1;
  MemPool *pMVar2;
  long *plVar3;
  XMLNode *addThis;
  int iVar4;
  char *pcVar5;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_01;
  long lVar7;
  char *pcVar8;
  char cVar9;
  XMLNode *node;
  StrPair endTag;
  XMLNode *local_58;
  StrPair local_50;
  StrPair *local_38;
  undefined4 extraout_var_00;
  
  if ((p != (char *)0x0) && (*p != '\0')) {
    local_38 = parentEnd;
    do {
      local_58 = (XMLNode *)0x0;
      pcVar5 = XMLDocument::Identify(this->_document,p,&local_58);
      addThis = local_58;
      if (local_58 == (XMLNode *)0x0) {
        return (char *)0x0;
      }
      local_50._flags = 0;
      local_50._start = (char *)0x0;
      local_50._end = (char *)0x0;
      iVar4 = (*local_58->_vptr_XMLNode[0x11])(local_58,pcVar5,&local_50);
      p = (char *)CONCAT44(extraout_var,iVar4);
      if (p == (char *)0x0) {
        pMVar2 = addThis->_memPool;
        (*addThis->_vptr_XMLNode[0xf])(addThis);
        (*pMVar2->_vptr_MemPool[4])(pMVar2,addThis);
        pXVar1 = this->_document;
        if (pXVar1->_errorID == XML_NO_ERROR) {
          pXVar1->_errorID = XML_ERROR_PARSING;
          pXVar1->_errorStr1 = (char *)0x0;
          pXVar1->_errorStr2 = (char *)0x0;
        }
        goto LAB_001a487b;
      }
      iVar4 = (*addThis->_vptr_XMLNode[4])(addThis);
      plVar6 = (long *)CONCAT44(extraout_var_00,iVar4);
      if ((plVar6 != (long *)0x0) &&
         (pXVar1 = this->_document, (pXVar1->super_XMLNode)._firstChild != (XMLNode *)0x0)) {
        lVar7 = (**(code **)(*plVar6 + 0x48))(plVar6);
        if (lVar7 == 0) {
          pcVar5 = StrPair::GetStr((StrPair *)(plVar6 + 3));
        }
        else {
          pcVar5 = (char *)0x0;
        }
        pXVar1->_errorID = XML_ERROR_PARSING_DECLARATION;
        pXVar1->_errorStr1 = pcVar5;
        pXVar1->_errorStr2 = (char *)0x0;
        plVar3 = (long *)plVar6[10];
        (**(code **)(*plVar6 + 0x78))(plVar6);
        (**(code **)(*plVar3 + 0x20))(plVar3,plVar6);
        goto LAB_001a487b;
      }
      iVar4 = (**addThis->_vptr_XMLNode)(addThis);
      plVar6 = (long *)CONCAT44(extraout_var_01,iVar4);
      if (plVar6 != (long *)0x0) {
        iVar4 = (int)plVar6[0xb];
        if (iVar4 == 2) {
          if (local_38 != (StrPair *)0x0) {
            StrPair::TransferTo((StrPair *)(plVar6 + 3),local_38);
          }
          (*addThis->_memPool->_vptr_MemPool[5])();
          pMVar2 = addThis->_memPool;
          (*addThis->_vptr_XMLNode[0xf])(addThis);
          (*pMVar2->_vptr_MemPool[4])(pMVar2,addThis);
          StrPair::~StrPair(&local_50);
          return p;
        }
        if (local_50._start == local_50._end) {
          if (iVar4 == 0) goto LAB_001a478c;
        }
        else {
          if (iVar4 != 0) {
LAB_001a478c:
            pXVar1 = this->_document;
            lVar7 = (**(code **)(*plVar6 + 0x48))(plVar6);
            if (lVar7 == 0) {
              pcVar5 = StrPair::GetStr((StrPair *)(plVar6 + 3));
            }
            else {
              pcVar5 = (char *)0x0;
            }
            pXVar1->_errorID = XML_ERROR_MISMATCHED_ELEMENT;
            pXVar1->_errorStr1 = pcVar5;
            pXVar1->_errorStr2 = (char *)0x0;
            pMVar2 = addThis->_memPool;
            (*addThis->_vptr_XMLNode[0xf])(addThis);
            (*pMVar2->_vptr_MemPool[4])(pMVar2,addThis);
LAB_001a487b:
            StrPair::~StrPair(&local_50);
            return (char *)0x0;
          }
          pcVar5 = StrPair::GetStr(&local_50);
          lVar7 = (**(code **)(*plVar6 + 0x48))(plVar6);
          if (lVar7 == 0) {
            pcVar8 = StrPair::GetStr((StrPair *)(plVar6 + 3));
          }
          else {
            pcVar8 = (char *)0x0;
          }
          if (pcVar5 != pcVar8) {
            cVar9 = *pcVar5;
            if (cVar9 != '\0') {
              lVar7 = 0;
              do {
                if ((cVar9 != pcVar8[lVar7]) || ((int)lVar7 == 0x7fffffff)) {
                  if ((int)lVar7 != 0x7fffffff) goto LAB_001a478c;
                  goto LAB_001a472e;
                }
                cVar9 = pcVar5[lVar7 + 1];
                lVar7 = lVar7 + 1;
              } while (cVar9 != '\0');
              if ((int)lVar7 == 0x7fffffff) goto LAB_001a472e;
              pcVar8 = pcVar8 + lVar7;
            }
            if (*pcVar8 != '\0') goto LAB_001a478c;
          }
        }
      }
LAB_001a472e:
      InsertEndChild(this,addThis);
      StrPair::~StrPair(&local_50);
    } while (*p != '\0');
  }
  return (char *)0x0;
}

Assistant:

char* XMLNode::ParseDeep( char* p, StrPair* parentEnd )
{
    // This is a recursive method, but thinking about it "at the current level"
    // it is a pretty simple flat list:
    //		<foo/>
    //		<!-- comment -->
    //
    // With a special case:
    //		<foo>
    //		</foo>
    //		<!-- comment -->
    //
    // Where the closing element (/foo) *must* be the next thing after the opening
    // element, and the names must match. BUT the tricky bit is that the closing
    // element will be read by the child.
    //
    // 'endTag' is the end tag for this node, it is returned by a call to a child.
    // 'parentEnd' is the end tag for the parent, which is filled in and returned.

    while( p && *p ) {
        XMLNode* node = 0;

        p = _document->Identify( p, &node );
        if ( node == 0 ) {
            break;
        }

        StrPair endTag;
        p = node->ParseDeep( p, &endTag );
        if ( !p ) {
            DeleteNode( node );
            if ( !_document->Error() ) {
                _document->SetError( XML_ERROR_PARSING, 0, 0 );
            }
            break;
        }

        XMLDeclaration* decl = node->ToDeclaration();
        if ( decl ) {
                // A declaration can only be the first child of a document.
                // Set error, if document already has children.
                if ( !_document->NoChildren() ) {
                        _document->SetError( XML_ERROR_PARSING_DECLARATION, decl->Value(), 0);
                        DeleteNode( decl );
                        break;
                }
        }

        XMLElement* ele = node->ToElement();
        if ( ele ) {
            // We read the end tag. Return it to the parent.
            if ( ele->ClosingType() == XMLElement::CLOSING ) {
                if ( parentEnd ) {
                    ele->_value.TransferTo( parentEnd );
                }
                node->_memPool->SetTracked();   // created and then immediately deleted.
                DeleteNode( node );
                return p;
            }

            // Handle an end tag returned to this level.
            // And handle a bunch of annoying errors.
            bool mismatch = false;
            if ( endTag.Empty() ) {
                if ( ele->ClosingType() == XMLElement::OPEN ) {
                    mismatch = true;
                }
            }
            else {
                if ( ele->ClosingType() != XMLElement::OPEN ) {
                    mismatch = true;
                }
                else if ( !XMLUtil::StringEqual( endTag.GetStr(), ele->Name() ) ) {
                    mismatch = true;
                }
            }
            if ( mismatch ) {
                _document->SetError( XML_ERROR_MISMATCHED_ELEMENT, ele->Name(), 0 );
                DeleteNode( node );
                break;
            }
        }
        InsertEndChild( node );
    }
    return 0;
}